

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O1

bool __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Push
          (PageStack<Memory::MarkContext::MarkCandidate> *this,MarkCandidate item)

{
  MarkCandidate *pMVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *pCVar4;
  undefined4 *puVar5;
  size_t sVar6;
  
  if (this->nextEntry == this->chunkEnd) {
    pCVar4 = CreateChunk(this);
    if (pCVar4 == (Chunk *)0x0) {
      return false;
    }
    pCVar4->nextChunk = this->currentChunk;
    this->currentChunk = pCVar4;
    this->chunkStart = (MarkCandidate *)(pCVar4 + 1);
    this->chunkEnd = (MarkCandidate *)(pCVar4 + 0x80);
    this->nextEntry = (MarkCandidate *)(pCVar4 + 1);
  }
  if ((this->nextEntry < this->chunkStart) || (this->chunkEnd <= this->nextEntry)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x84,"(nextEntry >= chunkStart && nextEntry < chunkEnd)",
                       "nextEntry >= chunkStart && nextEntry < chunkEnd");
    if (!bVar3) goto LAB_006f710c;
    *puVar5 = 0;
  }
  pMVar1 = this->nextEntry;
  pMVar1->obj = item.obj;
  pMVar1->byteCount = item.byteCount;
  pMVar1 = this->nextEntry;
  this->nextEntry = pMVar1 + 1;
  sVar6 = this->count + 1;
  this->count = sVar6;
  if (sVar6 != (((long)(pMVar1 + 1) - (long)this->chunkStart >> 4) + this->pageCount * 0xfe) - 0xfe)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x8b,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar3) {
LAB_006f710c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Push(T item)
{
    if (nextEntry == chunkEnd)
    {
        Chunk * newChunk = CreateChunk();
        if (newChunk == nullptr)
        {
            return false;
        }

        newChunk->nextChunk = currentChunk;
        currentChunk = newChunk;

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkStart;
    }

    Assert(nextEntry >= chunkStart && nextEntry < chunkEnd);

    *nextEntry = item;
    nextEntry++;

#if DBG
    count++;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}